

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_lda_inc.c
# Opt level: O3

void work_lda_vxc_pol(xc_func_type *p,size_t np,double *rho,xc_lda_out_params *out)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double __x;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double __x_00;
  double dVar33;
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  double dVar40;
  double __x_01;
  double dVar41;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar42;
  double dVar43;
  double dVar44;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  double dVar93;
  double dVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double local_540;
  double local_4e0;
  double local_4a8;
  double local_418;
  double local_378;
  double local_310;
  
  if (np != 0) {
    sVar4 = 0;
    local_310 = 0.0;
    do {
      lVar3 = (long)(p->dim).rho * sVar4;
      dVar39 = rho[lVar3];
      if (p->nspin == 2) {
        dVar39 = dVar39 + rho[lVar3 + 1];
      }
      dVar111 = p->dens_threshold;
      if (dVar111 <= dVar39) {
        if ((p->nspin == 2) && (local_310 = rho[lVar3 + 1], rho[lVar3 + 1] <= dVar111)) {
          local_310 = dVar111;
        }
        dVar39 = rho[lVar3];
        if (rho[lVar3] <= dVar111) {
          dVar39 = dVar111;
        }
        dVar9 = cbrt(0.3183098861837907);
        dVar10 = dVar9 * 1.4422495703074083;
        dVar11 = dVar10 * 2.519842099789747;
        dVar40 = dVar39 - local_310;
        dVar39 = dVar39 + local_310;
        dVar60 = 1.0 / dVar39;
        __x_01 = dVar40 * dVar60 + 1.0;
        dVar111 = p->zeta_threshold;
        dVar12 = cbrt(dVar111);
        dVar13 = cbrt(__x_01);
        local_418 = dVar111 * dVar12;
        dVar14 = local_418;
        if (dVar111 < __x_01) {
          dVar14 = __x_01 * dVar13;
        }
        dVar15 = dVar14 * 1.5874010519681996;
        dVar16 = cbrt(dVar39);
        dVar17 = cbrt(9.0);
        dVar41 = dVar17 * dVar17 * dVar9 * dVar9 * p->cam_omega;
        dVar61 = 1.0 / dVar16;
        dVar62 = dVar61 * 1.4422495703074083;
        uVar5 = -(ulong)(__x_01 <= dVar111);
        dVar88 = (double)(uVar5 & (ulong)dVar12 | ~uVar5 & (ulong)dVar13);
        dVar80 = ((1.0 / dVar88) * dVar62 * dVar41) / 18.0;
        dVar17 = 1.92;
        if (dVar80 <= 1.92) {
          dVar17 = dVar80;
        }
        dVar18 = atan2(1.0,dVar17);
        dVar63 = dVar17 * dVar17;
        dVar19 = 1.0 / dVar63;
        dVar20 = log(dVar19 + 1.0);
        dVar112 = dVar80;
        if (dVar80 <= 1.92) {
          dVar112 = 1.92;
        }
        dVar113 = dVar112 * dVar112;
        dVar119 = dVar113 * dVar113;
        dVar116 = dVar119 * dVar119;
        dVar64 = dVar116 * dVar116;
        dVar107 = 1.0 / dVar64;
        dVar101 = 1.0 / (dVar64 * dVar64);
        dVar64 = 1.0 - dVar20 * (dVar63 + 3.0);
        dVar18 = dVar17 * dVar64 * 0.25 + dVar18;
        if (dVar80 < 1.92) {
          local_4e0 = dVar18 * -2.6666666666666665 * dVar17 + 1.0;
        }
        else {
          auVar59._0_8_ = dVar113 * dVar119;
          auVar91._0_8_ = dVar113 * dVar116;
          auVar91._8_8_ = dVar116 * dVar119;
          auVar57._8_8_ = dVar107;
          auVar57._0_8_ = dVar107;
          auVar96._8_8_ = dVar107;
          auVar96._0_8_ = dVar107;
          auVar98._8_8_ = dVar107;
          auVar98._0_8_ = dVar107;
          auVar56 = divpd(auVar57,auVar91);
          auVar77._0_8_ = 1.0 / (dVar116 * auVar59._0_8_);
          auVar77._8_8_ = dVar107;
          auVar77 = divpd(auVar77,_DAT_01040bc0);
          auVar100._8_8_ = dVar119;
          auVar100._0_8_ = dVar113;
          auVar95 = divpd(auVar96,auVar100);
          auVar96 = divpd(auVar95,_DAT_01040bd0);
          auVar59._8_8_ = dVar116;
          auVar95 = divpd(auVar98,auVar59);
          auVar98 = divpd(auVar95,_DAT_01040be0);
          auVar57 = divpd(auVar56,_DAT_01040bf0);
          auVar56._0_8_ = dVar107 / (dVar116 * auVar59._0_8_);
          auVar56._8_8_ = dVar101;
          auVar56 = divpd(auVar56,_DAT_01040c00);
          auVar95._8_8_ = dVar101;
          auVar95._0_8_ = dVar101;
          auVar95 = divpd(auVar95,auVar100);
          auVar95 = divpd(auVar95,_DAT_01040c10);
          local_4e0 = ((((((((((((1.0 / auVar91._8_8_) / -364.0 +
                                 (1.0 / auVar91._0_8_) / 231.0 +
                                 (1.0 / dVar116) / -135.0 +
                                 (1.0 / auVar59._0_8_) / 70.0 +
                                 (1.0 / dVar119) / -30.0 + (1.0 / dVar113) / 9.0 + auVar77._0_8_) -
                               auVar77._8_8_) + auVar96._0_8_) - auVar96._8_8_) + auVar98._0_8_) -
                           auVar98._8_8_) + auVar57._0_8_) - auVar57._8_8_) + auVar56._0_8_) -
                       auVar56._8_8_) + auVar95._0_8_) - auVar95._8_8_;
        }
        __x = 1.0 - dVar40 * dVar60;
        dVar1 = p->zeta_threshold;
        dVar21 = cbrt(__x);
        if (dVar1 < __x) {
          local_418 = __x * dVar21;
        }
        dVar42 = local_418 * 1.5874010519681996;
        uVar6 = -(ulong)(__x <= dVar1);
        dVar106 = (double)((ulong)dVar12 & uVar6 | ~uVar6 & (ulong)dVar21);
        dVar65 = (dVar62 * (1.0 / dVar106) * dVar41) / 18.0;
        dVar12 = 1.92;
        if (dVar65 <= 1.92) {
          dVar12 = dVar65;
        }
        dVar22 = atan2(1.0,dVar12);
        dVar43 = dVar12 * dVar12;
        dVar23 = 1.0 / dVar43;
        dVar24 = log(dVar23 + 1.0);
        dVar114 = dVar65;
        if (dVar65 <= 1.92) {
          dVar114 = 1.92;
        }
        dVar115 = dVar114 * dVar114;
        dVar120 = dVar115 * dVar115;
        dVar117 = dVar120 * dVar120;
        dVar44 = dVar117 * dVar117;
        dVar108 = 1.0 / dVar44;
        dVar102 = 1.0 / (dVar44 * dVar44);
        dVar44 = 1.0 - dVar24 * (dVar43 + 3.0);
        dVar22 = dVar12 * dVar44 * 0.25 + dVar22;
        if (dVar65 < 1.92) {
          dVar105 = dVar22 * -2.6666666666666665 * dVar12 + 1.0;
        }
        else {
          auVar36._0_8_ = dVar115 * dVar120;
          auVar92._0_8_ = dVar115 * dVar117;
          auVar92._8_8_ = dVar117 * dVar120;
          auVar58._8_8_ = dVar108;
          auVar58._0_8_ = dVar108;
          auVar97._8_8_ = dVar108;
          auVar97._0_8_ = dVar108;
          auVar99._8_8_ = dVar108;
          auVar99._0_8_ = dVar108;
          auVar59 = divpd(auVar58,auVar92);
          auVar78._0_8_ = 1.0 / (dVar117 * auVar36._0_8_);
          auVar78._8_8_ = dVar108;
          auVar57 = divpd(auVar78,_DAT_01040bc0);
          auVar79._8_8_ = dVar120;
          auVar79._0_8_ = dVar115;
          auVar56 = divpd(auVar97,auVar79);
          auVar77 = divpd(auVar56,_DAT_01040bd0);
          auVar36._8_8_ = dVar117;
          auVar56 = divpd(auVar99,auVar36);
          auVar100 = divpd(auVar56,_DAT_01040be0);
          auVar95 = divpd(auVar59,_DAT_01040bf0);
          auVar37._0_8_ = dVar108 / (dVar117 * auVar36._0_8_);
          auVar37._8_8_ = dVar102;
          auVar59 = divpd(auVar37,_DAT_01040c00);
          auVar38._8_8_ = dVar102;
          auVar38._0_8_ = dVar102;
          auVar56 = divpd(auVar38,auVar79);
          auVar56 = divpd(auVar56,_DAT_01040c10);
          dVar105 = ((((((((((((1.0 / auVar92._8_8_) / -364.0 +
                               (1.0 / auVar92._0_8_) / 231.0 +
                               (1.0 / dVar117) / -135.0 +
                               (1.0 / auVar36._0_8_) / 70.0 +
                               (1.0 / dVar120) / -30.0 + (1.0 / dVar115) / 9.0 + auVar57._0_8_) -
                             auVar57._8_8_) + auVar77._0_8_) - auVar77._8_8_) + auVar100._0_8_) -
                         auVar100._8_8_) + auVar95._0_8_) - auVar95._8_8_) + auVar59._0_8_) -
                     auVar59._8_8_) + auVar56._0_8_) - auVar56._8_8_;
        }
        dVar25 = dVar16 * dVar105;
        dVar45 = dVar61 * 2.519842099789747 * dVar10;
        dVar26 = dVar45 * 0.053425 + 1.0;
        dVar81 = SQRT(dVar45);
        local_540 = dVar81;
        if (dVar45 < 0.0) {
          local_540 = sqrt(dVar45);
        }
        dVar27 = dVar16 * local_4e0;
        if (dVar45 < 0.0) {
          dVar81 = sqrt(dVar45);
        }
        dVar81 = dVar81 * dVar45;
        dVar46 = dVar9 * dVar9 * 2.080083823051904;
        dVar66 = 1.0 / (dVar16 * dVar16);
        dVar67 = dVar66 * 1.5874010519681996 * dVar46;
        dVar47 = dVar67 * 0.123235 + dVar81 * 0.204775 + local_540 * 3.79785 + dVar45 * 0.8969;
        dVar28 = 16.081979498692537 / dVar47 + 1.0;
        dVar29 = log(dVar28);
        dVar30 = dVar29 * 0.0621814 * dVar26;
        dVar48 = dVar40 * dVar40;
        dVar68 = dVar39 * dVar39;
        dVar31 = 1.0 / (dVar68 * dVar68);
        dVar49 = dVar48 * dVar48 * dVar31;
        dVar14 = (dVar14 + local_418 + -2.0) * 1.9236610509315362;
        dVar32 = dVar45 * 0.05137 + 1.0;
        dVar50 = dVar67 * 0.1562925 + dVar81 * 0.420775 + local_540 * 7.05945 + dVar45 * 1.549425;
        __x_00 = 32.16395899738507 / dVar50 + 1.0;
        dVar33 = log(__x_00);
        dVar51 = dVar45 * 0.0278125 + 1.0;
        dVar52 = dVar67 * 0.1241775 + dVar81 * 0.1100325 + local_540 * 5.1785 + dVar45 * 0.905775;
        dVar81 = 29.608749977793437 / dVar52 + 1.0;
        dVar34 = log(dVar81);
        dVar69 = dVar51 * dVar34 * -0.0197516734986138 + dVar33 * -0.0310907 * dVar32 + dVar30;
        dVar53 = dVar51 * dVar34 * 0.0197516734986138;
        dVar70 = dVar53 * dVar14 + (dVar14 * dVar69 * dVar49 - dVar30);
        dVar67 = dVar67 * 0.25 + dVar45 * -0.225 + 3.2;
        dVar30 = 1.0 / dVar67;
        dVar54 = (dVar27 * -0.09375 * dVar15 * dVar11 - dVar25 * 0.09375 * dVar42 * dVar11) +
                 dVar30 * 3.4602 * dVar70;
        pdVar2 = out->zk;
        if ((pdVar2 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar3 = (long)(p->dim).zk * sVar4;
          pdVar2[lVar3] = pdVar2[lVar3] + dVar54;
        }
        dVar35 = (1.0 / dVar68) * dVar40;
        dVar93 = dVar60 - dVar35;
        dVar55 = 0.0;
        if (dVar111 < __x_01) {
          dVar55 = dVar93 * 1.3333333333333333 * dVar13;
        }
        dVar113 = dVar113 * dVar112;
        dVar121 = 1.0 / (dVar88 * dVar88);
        dVar82 = 1.0 / (dVar13 * dVar13);
        dVar71 = dVar112 * dVar119;
        dVar119 = dVar119 * dVar113;
        dVar124 = 1.0 / (dVar112 * dVar116);
        dVar118 = dVar107 / (dVar112 * dVar116);
        dVar83 = 1.0 / (dVar113 * dVar116);
        dVar84 = dVar107 / (dVar113 * dVar116);
        dVar85 = 1.0 / (dVar116 * dVar71);
        dVar86 = dVar107 / (dVar116 * dVar71);
        dVar87 = 1.0 / (dVar116 * dVar119);
        dVar103 = dVar107 / (dVar116 * dVar119);
        dVar94 = 1.0 / (dVar19 + 1.0);
        dVar109 = (dVar63 + 3.0) * (1.0 / (dVar63 * dVar17));
        dVar116 = local_4e0 * dVar66 * dVar15 * dVar11 * 0.03125;
        dVar61 = dVar61 / dVar39;
        dVar88 = ((1.0 / dVar88) * dVar61 * 1.4422495703074083 * dVar41) / -54.0;
        dVar63 = ((double)(~uVar5 & (ulong)((dVar93 * dVar82) / 3.0)) * dVar121 * dVar62 * dVar41) /
                 -18.0 + dVar88;
        uVar7 = -(ulong)(1.92 < dVar80);
        if (dVar80 < 1.92) {
          dVar63 = (double)(~uVar7 & (ulong)dVar63);
          local_378 = dVar18 * -2.6666666666666665 * dVar63 +
                      ((dVar20 * -2.0 * dVar63 * dVar17 +
                       (dVar63 * dVar94 + dVar63 * dVar94) * dVar109) * dVar17 * 0.25 +
                      dVar19 * -dVar94 * dVar63 + dVar63 * dVar64 * 0.25) * -2.6666666666666665 *
                      dVar17;
        }
        else {
          dVar63 = (double)((ulong)dVar63 & uVar7);
          local_378 = dVar63 * 0.005120910384068279 * (dVar101 / dVar71) +
                      dVar63 * -0.0056808688387635755 * (dVar101 / dVar113) +
                      dVar63 * 0.006337888690829867 * (dVar101 / dVar112) +
                      dVar63 * -0.007115749525616698 * dVar103 +
                      dVar63 * 0.008045977011494253 * dVar86 +
                      dVar63 * -0.009171075837742505 * dVar84 +
                      dVar63 * 0.01054945054945055 * dVar118 +
                      dVar63 * -0.012263099219620958 * (dVar107 / dVar119) +
                      dVar63 * 0.01443001443001443 * (dVar107 / dVar71) +
                      dVar63 * -0.01722488038277512 * (dVar107 / dVar113) +
                      dVar63 * 0.02091503267973856 * (dVar107 / dVar112) +
                      dVar63 * -0.025925925925925925 * dVar87 +
                      dVar63 * 0.03296703296703297 * dVar85 +
                      dVar63 * -0.04329004329004329 * dVar83 +
                      dVar63 * 0.05925925925925926 * dVar124 +
                      dVar63 * -0.08571428571428572 * (1.0 / dVar119) +
                      dVar63 * -0.2222222222222222 * (1.0 / dVar113) +
                      dVar63 * 0.13333333333333333 * (1.0 / dVar71);
        }
        dVar72 = 1.0 / (dVar21 * dVar21);
        dVar63 = 0.0;
        if (dVar1 < __x) {
          dVar63 = (dVar72 * dVar93) / -3.0;
        }
        dVar89 = (double)(~uVar6 & (ulong)(dVar93 * -1.3333333333333333 * dVar21));
        dVar115 = dVar115 * dVar114;
        dVar127 = 1.0 / (dVar106 * dVar106);
        dVar93 = dVar114 * dVar120;
        dVar120 = dVar120 * dVar115;
        dVar90 = 1.0 / (dVar114 * dVar117);
        dVar110 = 1.0 / (dVar115 * dVar117);
        dVar104 = dVar108 / (dVar114 * dVar117);
        dVar73 = dVar108 / (dVar115 * dVar117);
        dVar74 = 1.0 / (dVar117 * dVar93);
        dVar75 = dVar108 / (dVar117 * dVar93);
        dVar76 = 1.0 / (dVar117 * dVar120);
        dVar122 = dVar108 / (dVar117 * dVar120);
        dVar125 = 1.0 / (dVar23 + 1.0);
        dVar117 = (dVar43 + 3.0) * (1.0 / (dVar43 * dVar12));
        dVar43 = dVar105 * dVar66 * dVar42 * dVar11 * 0.03125;
        dVar106 = (dVar61 * 1.4422495703074083 * (1.0 / dVar106) * dVar41) / -54.0;
        dVar63 = (dVar63 * dVar127 * dVar62 * dVar41) / -18.0 + dVar106;
        uVar8 = -(ulong)(1.92 < dVar65);
        if (dVar65 < 1.92) {
          dVar63 = (double)(~uVar8 & (ulong)dVar63);
          dVar63 = ((dVar24 * -2.0 * dVar63 * dVar12 +
                    (dVar125 * dVar63 + dVar125 * dVar63) * dVar117) * dVar12 * 0.25 +
                   dVar23 * -dVar125 * dVar63 + dVar44 * dVar63 * 0.25) * -2.6666666666666665 *
                   dVar12 + dVar22 * -2.6666666666666665 * dVar63;
        }
        else {
          dVar63 = (double)((ulong)dVar63 & uVar8);
          dVar63 = dVar63 * 0.005120910384068279 * (dVar102 / dVar93) +
                   dVar63 * -0.0056808688387635755 * (dVar102 / dVar115) +
                   dVar63 * 0.006337888690829867 * (dVar102 / dVar114) +
                   dVar63 * -0.007115749525616698 * dVar122 +
                   dVar63 * 0.008045977011494253 * dVar75 +
                   dVar63 * -0.009171075837742505 * dVar73 +
                   dVar63 * 0.01054945054945055 * dVar104 +
                   dVar63 * -0.012263099219620958 * (dVar108 / dVar120) +
                   dVar63 * 0.01443001443001443 * (dVar108 / dVar93) +
                   dVar63 * -0.01722488038277512 * (dVar108 / dVar115) +
                   dVar63 * 0.02091503267973856 * (dVar108 / dVar114) +
                   dVar63 * -0.025925925925925925 * dVar76 +
                   dVar63 * 0.03296703296703297 * dVar74 +
                   dVar63 * -0.04329004329004329 * dVar110 +
                   dVar63 * 0.05925925925925926 * dVar90 +
                   dVar63 * -0.08571428571428572 * (1.0 / dVar120) +
                   dVar63 * -0.2222222222222222 * (1.0 / dVar115) +
                   dVar63 * 0.13333333333333333 * (1.0 / dVar93);
        }
        dVar123 = dVar61 * 2.519842099789747;
        dVar105 = dVar29 * 0.0011073470983333333 * dVar123 * dVar10;
        dVar128 = dVar9 * 2.519842099789747 * dVar61;
        dVar126 = (1.4422495703074083 / local_540) * dVar128;
        dVar29 = dVar10 * dVar123;
        if (dVar45 < 0.0) {
          dVar45 = sqrt(dVar45);
        }
        else {
          dVar45 = SQRT(dVar45);
        }
        dVar128 = dVar128 * dVar45 * 1.4422495703074083;
        dVar46 = dVar46 * (dVar66 / dVar39) * 1.5874010519681996;
        dVar28 = dVar26 * (1.0 / (dVar47 * dVar47)) *
                 (1.0 / dVar28) *
                 (dVar46 * -0.08215666666666667 +
                 dVar128 * -0.1023875 + dVar126 * -0.632975 + dVar29 * -0.29896666666666666);
        dVar26 = dVar14 * dVar69 * 4.0;
        dVar40 = dVar40 * dVar48 * dVar31 * dVar26;
        dVar26 = dVar48 * dVar48 * (1.0 / (dVar68 * dVar68 * dVar39)) * dVar26;
        dVar45 = 1.0 / (dVar52 * dVar52);
        dVar47 = (1.0 / dVar81) *
                 (dVar46 * -0.082785 +
                 dVar128 * -0.05501625 + dVar126 * -0.8630833333333333 + dVar29 * -0.301925);
        dVar81 = dVar9 * 2.519842099789747 * dVar61 * dVar34 * 0.00018311447306006544 *
                 dVar14 * 1.4422495703074083;
        dVar9 = dVar45 * dVar47 * 0.5848223622634646 * dVar51 * dVar14;
        dVar31 = dVar28 + dVar105;
        dVar61 = (dVar55 + dVar89) * 1.9236610509315362;
        dVar10 = (dVar47 * 0.5848223622634646 * dVar51 * dVar45 +
                 dVar34 * 0.00018311447306006544 * dVar123 * dVar10 +
                 (((dVar33 * 0.0005323764196666666 * dVar123 * dVar10 +
                   (1.0 / __x_00) *
                   (dVar46 * -0.104195 +
                   dVar128 * -0.2103875 + dVar126 * -1.176575 + dVar29 * -0.516475) *
                   dVar32 * (1.0 / (dVar50 * dVar50))) - dVar105) - dVar28)) * dVar14 * dVar49;
        dVar14 = (dVar29 * 0.075 + dVar46 / -6.0) * (1.0 / (dVar67 * dVar67)) * dVar70 * 3.4602;
        pdVar2 = out->vrho;
        if ((pdVar2 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar3 = (long)(p->dim).vrho * sVar4;
          pdVar2[lVar3] =
               (((((((dVar55 * 1.5874010519681996 * dVar27 * dVar11 * -0.09375 - dVar116) -
                    local_378 * dVar16 * dVar15 * dVar11 * 0.09375) -
                   dVar89 * 1.5874010519681996 * dVar25 * dVar11 * 0.09375) - dVar43) -
                 dVar63 * dVar16 * dVar42 * dVar11 * 0.09375) +
                (((dVar61 * dVar69 * dVar49 + ((dVar40 + dVar31) - dVar26) + dVar10 +
                  dVar53 * dVar61) - dVar81) - dVar9) * dVar30 * 3.4602) - dVar14) * dVar39 + dVar54
               + pdVar2[lVar3];
        }
        dVar35 = -dVar60 - dVar35;
        dVar60 = 0.0;
        if (dVar111 < __x_01) {
          dVar60 = dVar13 * dVar35 * 1.3333333333333333;
        }
        dVar88 = dVar88 + (dVar121 * (double)(~uVar5 & (ulong)((dVar82 * dVar35) / 3.0)) * dVar62 *
                          dVar41) / -18.0;
        if (dVar80 < 1.92) {
          dVar88 = (double)(~uVar7 & (ulong)dVar88);
          local_4a8 = dVar18 * -2.6666666666666665 * dVar88 +
                      ((dVar20 * -2.0 * dVar88 * dVar17 +
                       dVar109 * (dVar94 * dVar88 + dVar94 * dVar88)) * dVar17 * 0.25 +
                      -dVar94 * dVar19 * dVar88 + dVar64 * dVar88 * 0.25) * -2.6666666666666665 *
                      dVar17;
        }
        else {
          dVar88 = (double)(uVar7 & (ulong)dVar88);
          local_4a8 = (dVar101 / dVar71) * dVar88 * 0.005120910384068279 +
                      (dVar101 / dVar113) * dVar88 * -0.0056808688387635755 +
                      (dVar101 / dVar112) * dVar88 * 0.006337888690829867 +
                      dVar103 * dVar88 * -0.007115749525616698 +
                      dVar86 * dVar88 * 0.008045977011494253 +
                      dVar84 * dVar88 * -0.009171075837742505 +
                      dVar118 * dVar88 * 0.01054945054945055 +
                      (dVar107 / dVar119) * dVar88 * -0.012263099219620958 +
                      (dVar107 / dVar71) * dVar88 * 0.01443001443001443 +
                      (dVar107 / dVar113) * dVar88 * -0.01722488038277512 +
                      (dVar107 / dVar112) * dVar88 * 0.02091503267973856 +
                      dVar87 * dVar88 * -0.025925925925925925 +
                      dVar85 * dVar88 * 0.03296703296703297 +
                      dVar83 * dVar88 * -0.04329004329004329 +
                      dVar124 * dVar88 * 0.05925925925925926 +
                      (1.0 / dVar119) * dVar88 * -0.08571428571428572 +
                      dVar88 * -0.2222222222222222 * (1.0 / dVar113) +
                      dVar88 * (1.0 / dVar71) * 0.13333333333333333;
        }
        dVar111 = 0.0;
        if (dVar1 < __x) {
          dVar111 = (dVar72 * dVar35) / -3.0;
        }
        dVar13 = (double)(~uVar6 & (ulong)(dVar35 * -1.3333333333333333 * dVar21));
        dVar106 = dVar106 + (dVar41 * dVar62 * dVar127 * dVar111) / -18.0;
        if (dVar65 < 1.92) {
          dVar106 = (double)(~uVar8 & (ulong)dVar106);
          dVar111 = ((dVar24 * -2.0 * dVar106 * dVar12 +
                     dVar117 * (dVar125 * dVar106 + dVar125 * dVar106)) * dVar12 * 0.25 +
                    -dVar125 * dVar23 * dVar106 + dVar44 * dVar106 * 0.25) * -2.6666666666666665 *
                    dVar12 + dVar22 * -2.6666666666666665 * dVar106;
        }
        else {
          dVar106 = (double)(uVar8 & (ulong)dVar106);
          dVar111 = (dVar102 / dVar93) * dVar106 * 0.005120910384068279 +
                    (dVar102 / dVar115) * dVar106 * -0.0056808688387635755 +
                    (dVar102 / dVar114) * dVar106 * 0.006337888690829867 +
                    dVar122 * dVar106 * -0.007115749525616698 +
                    dVar75 * dVar106 * 0.008045977011494253 +
                    dVar73 * dVar106 * -0.009171075837742505 +
                    dVar104 * dVar106 * 0.01054945054945055 +
                    (dVar108 / dVar120) * dVar106 * -0.012263099219620958 +
                    (dVar108 / dVar93) * dVar106 * 0.01443001443001443 +
                    (dVar108 / dVar115) * dVar106 * -0.01722488038277512 +
                    (dVar108 / dVar114) * dVar106 * 0.02091503267973856 +
                    dVar76 * dVar106 * -0.025925925925925925 +
                    dVar74 * dVar106 * 0.03296703296703297 +
                    dVar110 * dVar106 * -0.04329004329004329 +
                    dVar90 * dVar106 * 0.05925925925925926 +
                    (1.0 / dVar120) * dVar106 * -0.08571428571428572 +
                    dVar106 * -0.2222222222222222 * (1.0 / dVar115) +
                    dVar106 * (1.0 / dVar93) * 0.13333333333333333;
        }
        dVar12 = (dVar60 + dVar13) * 1.9236610509315362;
        if ((pdVar2 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar3 = (long)(p->dim).vrho * sVar4;
          pdVar2[lVar3 + 1] =
               ((dVar30 * (((dVar53 * dVar12 +
                            dVar69 * dVar12 * dVar49 + ((dVar31 - dVar40) - dVar26) + dVar10) -
                           dVar81) - dVar9) * 3.4602 +
                ((((dVar60 * 1.5874010519681996 * dVar27 * dVar11 * -0.09375 - dVar116) -
                  dVar15 * local_4a8 * dVar16 * dVar11 * 0.09375) -
                 dVar13 * 1.5874010519681996 * dVar25 * dVar11 * 0.09375) - dVar43) +
                dVar42 * dVar111 * dVar16 * dVar11 * -0.09375) - dVar14) * dVar39 + dVar54 +
               pdVar2[lVar3 + 1];
        }
      }
      sVar4 = sVar4 + 1;
    } while (np != sVar4);
  }
  return;
}

Assistant:

static void
WORK_LDA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, xc_lda_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    if(p->nspin == XC_POLARIZED){
      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}